

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O0

void __thiscall
soplex::LPColSetBase<double>::LPColSetBase(LPColSetBase<double> *this,LPColSetBase<double> *rs)

{
  DataArray<int> *in_RDI;
  VectorBase<double> *in_stack_ffffffffffffffb8;
  VectorBase<double> *in_stack_ffffffffffffffc0;
  DataArray<int> *old;
  SVSetBase<double> *in_stack_ffffffffffffffd8;
  SVSetBase<double> *in_stack_ffffffffffffffe0;
  
  SVSetBase<double>::SVSetBase(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined ***)in_RDI = &PTR__LPColSetBase_00896d28;
  VectorBase<double>::VectorBase(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  old = (DataArray<int> *)&in_RDI[5].data;
  VectorBase<double>::VectorBase(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  VectorBase<double>::VectorBase((VectorBase<double> *)&in_RDI[6].data,in_stack_ffffffffffffffb8);
  DataArray<int>::DataArray(in_RDI,old);
  return;
}

Assistant:

LPColSetBase(const LPColSetBase<R>& rs)
      : SVSetBase<R>(rs)
      , low(rs.low)
      , up(rs.up)
      , object(rs.object)
      , scaleExp(rs.scaleExp)
   {
      assert(isConsistent());
   }